

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

int __thiscall banksia::ChessBoard::findKing(ChessBoard *this,Side side)

{
  pointer pPVar1;
  uint uVar2;
  ulong uVar3;
  
  pPVar1 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (uint)((ulong)((long)(this->super_BoardCore).pieces.
                               super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) >> 3);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if ((pPVar1[uVar3].type == king) && (pPVar1[uVar3].side == side)) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  return -1;
}

Assistant:

int ChessBoard::findKing(Side side) const
{
    for (int pos = 0; pos < int(pieces.size()); ++pos) {
        if (isPiece(pos, PieceType::king, side)) {
            return pos;
        }
    }
    return -1;
}